

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O0

void __thiscall llvm::MD5::final(MD5 *this,MD5Result *Result)

{
  uint8_t *puVar1;
  ulong uVar2;
  ArrayRef<unsigned_char> AVar3;
  ulong local_28;
  unsigned_long free;
  unsigned_long used;
  MD5Result *Result_local;
  MD5 *this_local;
  
  uVar2 = (ulong)(this->lo & 0x3f);
  free = uVar2 + 1;
  this->buffer[uVar2] = 0x80;
  local_28 = 0x40 - free;
  if (local_28 < 8) {
    memset(this->buffer + uVar2 + 1,0,local_28);
    AVar3 = makeArrayRef<unsigned_char>(this->buffer,0x40);
    body(this,AVar3);
    free = 0;
    local_28 = 0x40;
  }
  memset(this->buffer + free,0,local_28 - 8);
  this->lo = this->lo << 3;
  support::endian::write32le(this->buffer + 0x38,this->lo);
  support::endian::write32le(this->buffer + 0x3c,this->hi);
  AVar3 = makeArrayRef<unsigned_char>(this->buffer,0x40);
  body(this,AVar3);
  puVar1 = MD5Result::operator[](Result,0);
  support::endian::write32le(puVar1,this->a);
  puVar1 = MD5Result::operator[](Result,4);
  support::endian::write32le(puVar1,this->b);
  puVar1 = MD5Result::operator[](Result,8);
  support::endian::write32le(puVar1,this->c);
  puVar1 = MD5Result::operator[](Result,0xc);
  support::endian::write32le(puVar1,this->d);
  return;
}

Assistant:

void MD5::final(MD5Result &Result) {
  unsigned long used, free;

  used = lo & 0x3f;

  buffer[used++] = 0x80;

  free = 64 - used;

  if (free < 8) {
    memset(&buffer[used], 0, free);
    body(makeArrayRef(buffer, 64));
    used = 0;
    free = 64;
  }

  memset(&buffer[used], 0, free - 8);

  lo <<= 3;
  support::endian::write32le(&buffer[56], lo);
  support::endian::write32le(&buffer[60], hi);

  body(makeArrayRef(buffer, 64));

  support::endian::write32le(&Result[0], a);
  support::endian::write32le(&Result[4], b);
  support::endian::write32le(&Result[8], c);
  support::endian::write32le(&Result[12], d);
}